

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
cbtCompoundCollisionAlgorithm::cbtCompoundCollisionAlgorithm
          (cbtCompoundCollisionAlgorithm *this,cbtCollisionAlgorithmConstructionInfo *ci,
          cbtCollisionObjectWrapper *body0Wrap,cbtCollisionObjectWrapper *body1Wrap,bool isSwapped)

{
  cbtCollisionObjectWrapper *pcVar1;
  undefined3 in_register_00000081;
  
  cbtActivatingCollisionAlgorithm::cbtActivatingCollisionAlgorithm
            (&this->super_cbtActivatingCollisionAlgorithm,ci,body0Wrap,body1Wrap);
  (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.
  _vptr_cbtCollisionAlgorithm = (_func_int **)&PTR__cbtCompoundCollisionAlgorithm_00b483e8;
  (this->stack2).m_ownsMemory = true;
  (this->stack2).m_data = (cbtDbvtNode **)0x0;
  (this->stack2).m_size = 0;
  (this->stack2).m_capacity = 0;
  (this->manifoldArray).m_ownsMemory = true;
  (this->manifoldArray).m_data = (cbtPersistentManifold **)0x0;
  (this->manifoldArray).m_size = 0;
  (this->manifoldArray).m_capacity = 0;
  (this->m_childCollisionAlgorithms).m_ownsMemory = true;
  (this->m_childCollisionAlgorithms).m_data = (cbtCollisionAlgorithm **)0x0;
  (this->m_childCollisionAlgorithms).m_size = 0;
  (this->m_childCollisionAlgorithms).m_capacity = 0;
  this->m_isSwapped = isSwapped;
  pcVar1 = body0Wrap;
  if (CONCAT31(in_register_00000081,isSwapped) != 0) {
    pcVar1 = body1Wrap;
  }
  this->m_sharedManifold = ci->m_manifold;
  this->m_ownsManifold = false;
  this->m_compoundShapeRevision = pcVar1->m_shape[3].m_shapeType;
  preallocateChildAlgorithms(this,body0Wrap,body1Wrap);
  return;
}

Assistant:

cbtCompoundCollisionAlgorithm::cbtCompoundCollisionAlgorithm(const cbtCollisionAlgorithmConstructionInfo& ci, const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, bool isSwapped)
	: cbtActivatingCollisionAlgorithm(ci, body0Wrap, body1Wrap),
	  m_isSwapped(isSwapped),
	  m_sharedManifold(ci.m_manifold)
{
	m_ownsManifold = false;

	const cbtCollisionObjectWrapper* colObjWrap = m_isSwapped ? body1Wrap : body0Wrap;
	cbtAssert(colObjWrap->getCollisionShape()->isCompound());

	const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(colObjWrap->getCollisionShape());
	m_compoundShapeRevision = compoundShape->getUpdateRevision();

	preallocateChildAlgorithms(body0Wrap, body1Wrap);
}